

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImGuiTableCellData *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  char cVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *pIVar6;
  ImGuiTableColumn *pIVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  bool bVar10;
  ImGuiContext *pIVar11;
  ImGuiTableInstanceData *pIVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ImGuiTableCellData *pIVar17;
  int iVar18;
  ImU32 col;
  ImU32 col_00;
  uint uVar19;
  uint uVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  float fVar31;
  ulong uVar30;
  ImRect row_rect;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImU32 local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [16];
  ImVec2 local_50;
  undefined1 local_48 [16];
  undefined1 auVar25 [16];
  
  pIVar11 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar11->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  (pIVar5->DC).CursorPos.y = table->RowPosY2;
  fVar23 = table->RowPosY1;
  auVar24 = ZEXT416((uint)fVar23);
  fVar28 = table->RowPosY2;
  auVar26 = ZEXT416((uint)fVar28);
  iVar15 = table->CurrentRow;
  iVar16 = (int)table->FreezeRowsCount;
  iVar18 = (int)table->FreezeRowsRequest;
  if (iVar15 == 0) {
    if ((long)table->InstanceCurrent == 0) {
      pIVar12 = &table->InstanceDataFirst;
    }
    else {
      pIVar12 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
    }
    pIVar12->LastFirstRowHeight = fVar28 - fVar23;
  }
  iVar15 = iVar15 + 1;
  if (((table->InnerClipRect).Min.y <= fVar28) && (fVar23 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_70 = iVar18;
    local_68 = auVar24;
    local_48 = auVar26;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      fVar23 = (float)local_68._0_4_;
    }
    col = table->RowBgColor[1];
    local_74 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       (local_74 = 0, (table->Flags & 0x80) != 0)) {
      local_74 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar4 = table->RowCellDataCurrent;
    local_6c = iVar16;
    if ((-1 < cVar4 || iVar15 == iVar16) || (local_74 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar23 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar28 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar21 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar6 = pIVar5->DrawList;
        (pIVar6->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar6->_CmdHeader).ClipRect.y = fVar23;
        (pIVar6->_CmdHeader).ClipRect.z = fVar28;
        (pIVar6->_CmdHeader).ClipRect.w = fVar21;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar5->DrawList,0);
      fVar23 = (float)local_68._0_4_;
    }
    if (col != 0 || col_00 != 0) {
      fVar28 = (table->WorkRect).Min.x;
      fVar21 = (table->WorkRect).Max.x;
      IVar3 = (table->BgClipRect).Min;
      fVar29 = IVar3.x;
      fVar31 = IVar3.y;
      uVar19 = -(uint)(fVar29 <= fVar28);
      uVar20 = -(uint)(fVar31 <= fVar23);
      local_88 = (ImVec2)(CONCAT44(~uVar20 & (uint)fVar31,~uVar19 & (uint)fVar29) |
                         CONCAT44((uint)fVar23 & uVar20,(uint)fVar28 & uVar19));
      auVar26._8_8_ = 0;
      auVar26._0_4_ = (table->BgClipRect).Max.x;
      auVar26._4_4_ = (table->BgClipRect).Max.y;
      auVar25._4_8_ = 0;
      auVar25._0_4_ = fVar21;
      auVar25._12_4_ = local_48._4_4_;
      auVar24._8_8_ = auVar25._8_8_;
      auVar24._4_4_ = local_48._0_4_;
      auVar24._0_4_ = fVar21;
      auVar26 = minps(auVar24,auVar26);
      IStack_80 = auVar26._0_8_;
      if ((col_00 != 0) && (IStack_80.y = auVar26._4_4_, bVar10 = local_88.y < IStack_80.y, bVar10))
      {
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_88,&IStack_80,col_00,0.0,0);
      }
      if ((col != 0) && (local_88.y < IStack_80.y)) {
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_88,&IStack_80,col,0.0,0);
      }
    }
    if ((-1 < cVar4) && (-1 < (long)table->RowCellDataCurrent)) {
      pIVar17 = (table->RowCellData).Data;
      pIVar1 = pIVar17 + table->RowCellDataCurrent;
      do {
        pIVar7 = (table->Columns).Data;
        fVar23 = (table->WorkRect).Min.x;
        uVar19 = -(uint)(fVar23 <= pIVar7[pIVar17->Column].MinX);
        fVar21 = (float)(~uVar19 & (uint)fVar23 | (uint)pIVar7[pIVar17->Column].MinX & uVar19);
        fVar23 = (table->WorkRect).Max.x;
        fVar28 = pIVar7[pIVar17->Column].MaxX;
        if (fVar23 <= pIVar7[pIVar17->Column].MaxX) {
          fVar28 = fVar23;
        }
        auVar22._4_4_ = table->RowPosY2;
        auVar22._0_4_ = fVar28;
        auVar22._8_8_ = 0;
        IVar3 = (table->BgClipRect).Min;
        fVar23 = IVar3.x;
        fVar28 = IVar3.y;
        uVar19 = -(uint)(fVar23 <= fVar21);
        uVar20 = -(uint)(fVar28 <= table->RowPosY1);
        uVar30 = CONCAT44(~uVar20 & (uint)fVar28,~uVar19 & (uint)fVar23) |
                 CONCAT44((uint)table->RowPosY1 & uVar20,(uint)fVar21 & uVar19);
        auVar27._8_8_ = 0;
        auVar27._0_4_ = (table->BgClipRect).Max.x;
        auVar27._4_4_ = (table->BgClipRect).Max.y;
        auVar26 = minps(auVar22,auVar27);
        local_88.x = (float)uVar30;
        fVar23 = pIVar7[pIVar17->Column].ClipRect.Min.x;
        uVar19 = -(uint)(fVar23 <= local_88.x);
        local_88.y = (float)(uVar30 >> 0x20);
        local_88.x = (float)(uVar19 & (uint)local_88.x | ~uVar19 & (uint)fVar23);
        IStack_80.x = auVar26._0_4_;
        if (pIVar7[pIVar17->Column].MaxX <= IStack_80.x) {
          IStack_80.x = pIVar7[pIVar17->Column].MaxX;
        }
        IStack_80.y = auVar26._4_4_;
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_88,&IStack_80,pIVar17->BgColor,0.0,0);
        pIVar17 = pIVar17 + 1;
      } while (pIVar17 <= pIVar1);
    }
    if (((local_74 != 0) && ((table->BgClipRect).Min.y <= (float)local_68._0_4_)) &&
       ((float)local_68._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.y = (float)local_68._0_4_;
      local_88.x = table->BorderX1;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_68._0_4_;
      ImDrawList::AddLine(pIVar5->DrawList,&local_88,&local_50,local_74,1.0);
    }
    iVar16 = local_6c;
    iVar18 = local_70;
    if (((iVar15 == local_6c) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.y = (float)local_48._0_4_;
      local_88.x = table->BorderX1;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar5->DrawList,&local_88,&local_50,table->BorderColorStrong,1.0);
    }
  }
  if ((iVar15 == iVar18) && (0 < table->ColumnsCount)) {
    lVar13 = 0x62;
    lVar14 = 0;
    do {
      *(bool *)((long)&((table->Columns).Data)->Flags + lVar13) = lVar14 < table->FreezeColumnsCount
      ;
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x68;
    } while (lVar14 < table->ColumnsCount);
  }
  if (iVar15 == iVar16) {
    table->IsUnfrozenRows = true;
    fVar23 = table->RowPosY2;
    fVar28 = (pIVar5->InnerClipRect).Min.y;
    uVar19 = -(uint)(fVar28 <= fVar23 + 1.0);
    fVar21 = (float)(~uVar19 & (uint)fVar28 | (uint)(fVar23 + 1.0) & uVar19);
    fVar28 = (pIVar5->InnerClipRect).Max.y;
    if (fVar28 <= fVar21) {
      fVar21 = fVar28;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar21;
    (table->BgClipRect).Min.y = fVar21;
    fVar28 = (pIVar5->InnerClipRect).Max.y;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar28;
    (table->BgClipRect).Max.y = fVar28;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    fVar28 = table->RowPosY1;
    fVar21 = (fVar23 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar5->DC).CursorPos.y = fVar21;
    table->RowPosY2 = fVar21;
    table->RowPosY1 = fVar21 - (fVar23 - fVar28);
    if (0 < table->ColumnsCount) {
      lVar13 = 0x59;
      lVar14 = 0;
      do {
        pIVar7 = (table->Columns).Data;
        *(undefined1 *)((long)pIVar7 + lVar13 + -2) = *(undefined1 *)((long)&pIVar7->Flags + lVar13)
        ;
        *(float *)((long)pIVar7 + lVar13 + -0x35) = (table->Bg2ClipRectForDrawCmd).Min.y;
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 0x68;
      } while (lVar14 < table->ColumnsCount);
    }
    pIVar7 = (table->Columns).Data;
    IVar3 = (pIVar7->ClipRect).Max;
    IVar8 = (pIVar7->ClipRect).Min;
    IVar9 = (pIVar7->ClipRect).Max;
    (pIVar5->ClipRect).Min = (pIVar7->ClipRect).Min;
    (pIVar5->ClipRect).Max = IVar3;
    pIVar6 = pIVar5->DrawList;
    (pIVar6->_CmdHeader).ClipRect.x = IVar8.x;
    (pIVar6->_CmdHeader).ClipRect.y = IVar8.y;
    (pIVar6->_CmdHeader).ClipRect.z = IVar9.x;
    (pIVar6->_CmdHeader).ClipRect.w = IVar9.y;
    pIVar2 = (pIVar5->DrawList->_ClipRectStack).Data +
             (long)(pIVar5->DrawList->_ClipRectStack).Size + -1;
    pIVar2->x = IVar8.x;
    pIVar2->y = IVar8.y;
    pIVar2->z = IVar9.x;
    pIVar2->w = IVar9.y;
    ImDrawListSplitter::SetCurrentChannel
              (table->DrawSplitter,pIVar5->DrawList,
               (uint)((table->Columns).Data)->DrawChannelCurrent);
  }
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        TableGetInstanceData(table, table->InstanceCurrent)->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}